

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::JunitReporter::JunitReporter(JunitReporter *this,ReporterConfig *_config)

{
  IConfig *pIVar1;
  
  (this->super_CumulativeReporterBase).super_SharedImpl<Catch::IStreamingReporter>.m_rc = 0;
  (this->super_CumulativeReporterBase).super_SharedImpl<Catch::IStreamingReporter>.
  super_IStreamingReporter.super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__CumulativeReporterBase_00174a50;
  pIVar1 = (_config->m_fullConfig).m_p;
  (this->super_CumulativeReporterBase).m_config.m_p = pIVar1;
  if (pIVar1 != (IConfig *)0x0) {
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[2])();
  }
  (this->super_CumulativeReporterBase).stream = _config->m_stream;
  memset(&(this->super_CumulativeReporterBase).m_assertions,0,0xa1);
  (this->super_CumulativeReporterBase).super_SharedImpl<Catch::IStreamingReporter>.
  super_IStreamingReporter.super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__JunitReporter_00174c38;
  XmlWriter::XmlWriter(&this->xml,_config->m_stream);
  (this->suiteTimer).m_ticks = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->stdOutForSuite);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->stdErrForSuite);
  (this->super_CumulativeReporterBase).m_reporterPrefs.shouldRedirectStdOut = true;
  return;
}

Assistant:

JunitReporter( ReporterConfig const& _config )
        :   CumulativeReporterBase( _config ),
            xml( _config.stream() )
        {
            m_reporterPrefs.shouldRedirectStdOut = true;
        }